

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O2

iterator __thiscall QJsonObject::findImpl<QStringView>(QJsonObject *this,QStringView key)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  iterator iVar3;
  bool keyExists;
  long local_18;
  long lVar2;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  keyExists = false;
  if ((this->o).d.ptr != (QCborContainerPrivate *)0x0) {
    qVar1 = indexOf<QStringView>(&this->o,key,&keyExists);
    if ((keyExists & 1U) != 0) {
      lVar2 = (qVar1 / 2) * 2 + 1;
      detach(this,0);
      goto LAB_002c4df3;
    }
  }
  iVar3 = end(this);
  lVar2 = iVar3.item.super_QJsonValueConstRef._8_8_;
  this = iVar3.item.super_QJsonValueConstRef.field_0;
LAB_002c4df3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    iVar3.item.super_QJsonValueConstRef._8_8_ = lVar2;
    iVar3.item.super_QJsonValueConstRef.field_0.o = this;
    return (iterator)iVar3.item.super_QJsonValueConstRef;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::iterator QJsonObject::findImpl(T key)
{
    bool keyExists = false;
    auto index = o ? indexOf(o, key, &keyExists) : 0;
    if (!keyExists)
        return end();
    detach();
    return {this, index / 2};
}